

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O1

void nghttp2_frame_origin_free(nghttp2_extension *frame,nghttp2_mem *mem)

{
  if (frame->payload != (void *)0x0) {
    nghttp2_mem_free(mem,*(void **)((long)frame->payload + 8));
    return;
  }
  return;
}

Assistant:

void nghttp2_frame_origin_free(nghttp2_extension *frame, nghttp2_mem *mem) {
  nghttp2_ext_origin *origin;

  origin = frame->payload;
  if (origin == NULL) {
    return;
  }
  /* We use the same buffer for all resources pointed by the field of
     origin directly or indirectly. */
  nghttp2_mem_free(mem, origin->ov);
}